

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shaderprogram.cpp
# Opt level: O1

void __thiscall
FShaderProgram::Compile
          (FShaderProgram *this,ShaderType type,char *lumpName,char *defines,int maxGlslVersion)

{
  int iVar1;
  FString code;
  FString local_50;
  FString local_48;
  int local_3c;
  
  local_3c = maxGlslVersion;
  iVar1 = FWadCollection::CheckNumForFullName(&Wads,lumpName,false,0);
  if (iVar1 == -1) {
    I_FatalError("Unable to load \'%s\'",lumpName);
  }
  FWadCollection::ReadLump((FWadCollection *)&stack0xffffffffffffffc8,0xa861c0);
  FString::AttachToOther(&local_50,(FString *)&stack0xffffffffffffffc8);
  FString::FString(&local_48,local_50.Chars);
  FString::~FString(&local_50);
  FMemLump::~FMemLump((FMemLump *)&stack0xffffffffffffffc8);
  Compile(this,type,lumpName,&local_48,defines,local_3c);
  FString::~FString(&local_48);
  return;
}

Assistant:

void FShaderProgram::Compile(ShaderType type, const char *lumpName, const char *defines, int maxGlslVersion)
{
	int lump = Wads.CheckNumForFullName(lumpName);
	if (lump == -1) I_FatalError("Unable to load '%s'", lumpName);
	FString code = Wads.ReadLump(lump).GetString().GetChars();
	Compile(type, lumpName, code, defines, maxGlslVersion);
}